

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_update.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::BindUpdateSet
          (Binder *this,LogicalOperator *op,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root,UpdateSetInfo *set_info,TableCatalogEntry *table,
          vector<duckdb::PhysicalIndex,_true> *columns)

{
  pointer pPVar1;
  pointer pPVar2;
  iterator __position;
  pointer pcVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined8 uVar6;
  bool bVar7;
  reference name;
  ColumnDefinition *this_00;
  __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
  _Var8;
  pointer pPVar9;
  LogicalType *pLVar10;
  element_type *this_01;
  pointer pEVar11;
  BoundColumnRefExpression *this_02;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> this_03;
  pointer this_04;
  BinderException *pBVar12;
  string *psVar13;
  long lVar14;
  size_type __n;
  ColumnBinding binding;
  vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *in_stack_00000008;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projection_expressions;
  UpdateBinder binder;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1a0;
  element_type *local_198;
  element_type *peStack_190;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_188;
  UpdateSetInfo *local_178;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_170;
  undefined1 local_168 [16];
  element_type *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  optional_ptr<duckdb::DummyBinding,_true> local_148;
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> local_140;
  optional_ptr<duckdb::LogicalType,_true> local_138;
  LogicalType local_130;
  undefined1 local_118 [8];
  LogicalType aLStack_110 [4];
  string *local_a8;
  idx_t *local_a0;
  size_type local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_178 = set_info;
  local_168._8_8_ = root;
  local_148.ptr = (DummyBinding *)op;
  local_158 = (element_type *)GenerateTableIndex((Binder *)op);
  local_198 = (element_type *)0x0;
  peStack_190 = (element_type *)0x0;
  local_188 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_140.ptr = (vector<duckdb::DummyBinding,_true> *)table;
  if (*(idx_t *)&(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.type !=
      (table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid) {
    local_a0 = &(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid;
    local_a8 = &(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name;
    local_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_168._8_8_ + 0x28);
    __n = 0;
    do {
      name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)local_a0,__n);
      local_98 = __n;
      local_138.ptr =
           (LogicalType *)
           vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                         *)local_a8,__n);
      bVar7 = TableCatalogEntry::ColumnExists((TableCatalogEntry *)columns,name);
      if (!bVar7) {
        pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
        local_118 = (undefined1  [8])&aLStack_110[0].type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"Referenced update column %s not found in table!","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar3 = (name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,pcVar3 + name->_M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar12,(string *)local_118,&local_50);
        __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this_00 = TableCatalogEntry::GetColumn((TableCatalogEntry *)columns,name);
      bVar7 = ColumnDefinition::Generated(this_00);
      if (bVar7) {
        pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
        local_118 = (undefined1  [8])&aLStack_110[0].type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"Cant update column \"%s\" because it is a generated column!"
                   ,"");
        psVar13 = ColumnDefinition::Name_abi_cxx11_(this_00);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar3 = (psVar13->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar3,pcVar3 + psVar13->_M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar12,(string *)local_118,&local_70);
        __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar1 = (in_stack_00000008->
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (in_stack_00000008->
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      local_118 = (undefined1  [8])ColumnDefinition::Physical(this_00);
      _Var8 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<duckdb::PhysicalIndex*,std::vector<duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::PhysicalIndex_const>>
                        (pPVar1,pPVar2,local_118);
      if (_Var8._M_current !=
          (in_stack_00000008->
          super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>)._M_impl
          .super__Vector_impl_data._M_finish) {
        pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
        local_118 = (undefined1  [8])&aLStack_110[0].type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"Multiple assignments to same column \"%s\"","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar3 = (name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,pcVar3 + name->_M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar12,(string *)local_118,&local_90);
        __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_118 = (undefined1  [8])ColumnDefinition::Physical(this_00);
      __position._M_current =
           (in_stack_00000008->
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (in_stack_00000008->
          super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::
        _M_realloc_insert<duckdb::PhysicalIndex>
                  (in_stack_00000008,__position,(PhysicalIndex *)local_118);
      }
      else {
        (__position._M_current)->index = (idx_t)local_118;
        (in_stack_00000008->
        super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)local_138.ptr);
      if ((pPVar9->super_BaseExpression).type == VALUE_DEFAULT) {
        pLVar10 = ColumnDefinition::Type(this_00);
        this_01 = (element_type *)operator_new(0x58);
        LogicalType::LogicalType((LogicalType *)local_118,pLVar10);
        BoundDefaultExpression::BoundDefaultExpression
                  ((BoundDefaultExpression *)this_01,(LogicalType *)local_118);
        LogicalType::~LogicalType((LogicalType *)local_118);
        local_130._0_8_ = this_01;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)local_150._M_pi,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_130);
        if ((element_type *)local_130._0_8_ != (element_type *)0x0) {
          (*((BaseExpression *)&((LogicalOperator *)local_130._0_8_)->_vptr_LogicalOperator)->
            _vptr_BaseExpression[1])();
        }
      }
      else {
        UpdateBinder::UpdateBinder
                  ((UpdateBinder *)local_118,(Binder *)local_148.ptr,
                   (ClientContext *)((local_148.ptr)->super_Binding).alias.catalog._M_dataplus._M_p)
        ;
        pLVar10 = ColumnDefinition::Type(this_00);
        uVar6 = aLStack_110[0]._0_8_;
        if (aLStack_110 != pLVar10) {
          uVar4 = pLVar10->id_;
          uVar5 = pLVar10->physical_type_;
          aLStack_110[0].physical_type_ = uVar5;
          aLStack_110[0].id_ = uVar4;
          aLStack_110[0]._2_6_ = SUB86(uVar6,2);
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&aLStack_110[0].type_info_,&pLVar10->type_info_);
        }
        ExpressionBinder::Bind
                  ((ExpressionBinder *)local_168,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_118,local_138,false);
        PlanSubqueries((Binder *)local_148.ptr,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_168,
                       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)local_178);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_168);
        lVar14 = (long)peStack_190 - (long)local_198;
        this_02 = (BoundColumnRefExpression *)operator_new(0x70);
        LogicalType::LogicalType(&local_130,&pEVar11->return_type);
        binding.column_index = lVar14 >> 3;
        binding.table_index = (idx_t)local_158;
        BoundColumnRefExpression::BoundColumnRefExpression(this_02,&local_130,binding,0);
        LogicalType::~LogicalType(&local_130);
        local_170._M_head_impl = (Expression *)this_02;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)local_150._M_pi,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_170);
        if ((BoundColumnRefExpression *)local_170._M_head_impl != (BoundColumnRefExpression *)0x0) {
          (*(((Expression *)&(local_170._M_head_impl)->super_BaseExpression)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_198,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_168);
        if ((Expression *)local_168._0_8_ != (Expression *)0x0) {
          (**(code **)(*(_func_int **)local_168._0_8_ + 8))();
        }
        ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_118);
      }
      __n = local_98 + 1;
    } while (__n < (ulong)((long)(*(long *)&(((StandardEntry *)
                                             &(local_140.ptr)->
                                              super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                                             )->super_InCatalogEntry).super_CatalogEntry.type -
                                 (((StandardEntry *)
                                  &(local_140.ptr)->
                                   super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                                  )->super_InCatalogEntry).super_CatalogEntry.oid) >> 5));
  }
  if ((*(char *)&(((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)(local_168._8_8_ + 8))->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl == 'f') ||
     (local_198 != peStack_190)) {
    this_03._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)operator_new(0x70);
    local_118 = (undefined1  [8])local_198;
    aLStack_110[0]._0_8_ = peStack_190;
    aLStack_110[0].type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_188;
    local_198 = (element_type *)0x0;
    peStack_190 = (element_type *)0x0;
    local_188 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LogicalProjection::LogicalProjection
              ((LogicalProjection *)
               this_03._M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,(idx_t)local_158,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_118);
    local_130._0_8_ =
         this_03._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_118);
    this_04 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&local_130);
    local_1a0._M_head_impl =
         *(LogicalOperator **)
          &(local_178->condition).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>;
    (local_178->condition).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> =
         (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
    LogicalOperator::AddChild
              (&this_04->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_1a0);
    if (local_1a0._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)((BaseExpression *)&(local_1a0._M_head_impl)->_vptr_LogicalOperator)->
                         _vptr_BaseExpression + 8))();
    }
    local_1a0._M_head_impl = (LogicalOperator *)0x0;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_130._0_8_;
  }
  else {
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_178->condition).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>;
    (local_178->condition).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> =
         (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_198);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::BindUpdateSet(LogicalOperator &op, unique_ptr<LogicalOperator> root,
                                                  UpdateSetInfo &set_info, TableCatalogEntry &table,
                                                  vector<PhysicalIndex> &columns) {
	auto proj_index = GenerateTableIndex();

	vector<unique_ptr<Expression>> projection_expressions;
	D_ASSERT(set_info.columns.size() == set_info.expressions.size());
	for (idx_t i = 0; i < set_info.columns.size(); i++) {
		auto &colname = set_info.columns[i];
		auto &expr = set_info.expressions[i];
		if (!table.ColumnExists(colname)) {
			throw BinderException("Referenced update column %s not found in table!", colname);
		}
		auto &column = table.GetColumn(colname);
		if (column.Generated()) {
			throw BinderException("Cant update column \"%s\" because it is a generated column!", column.Name());
		}
		if (std::find(columns.begin(), columns.end(), column.Physical()) != columns.end()) {
			throw BinderException("Multiple assignments to same column \"%s\"", colname);
		}
		columns.push_back(column.Physical());
		if (expr->GetExpressionType() == ExpressionType::VALUE_DEFAULT) {
			op.expressions.push_back(make_uniq<BoundDefaultExpression>(column.Type()));
		} else {
			UpdateBinder binder(*this, context);
			binder.target_type = column.Type();
			auto bound_expr = binder.Bind(expr);
			PlanSubqueries(bound_expr, root);

			op.expressions.push_back(make_uniq<BoundColumnRefExpression>(
			    bound_expr->return_type, ColumnBinding(proj_index, projection_expressions.size())));
			projection_expressions.push_back(std::move(bound_expr));
		}
	}
	if (op.type != LogicalOperatorType::LOGICAL_UPDATE && projection_expressions.empty()) {
		return root;
	}
	// now create the projection
	auto proj = make_uniq<LogicalProjection>(proj_index, std::move(projection_expressions));
	proj->AddChild(std::move(root));
	return unique_ptr_cast<LogicalProjection, LogicalOperator>(std::move(proj));
}